

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall
djb::brdf::sample(brdf *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf_out,void *user_args)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar3;
  _func_int **pp_Var4;
  float fVar5;
  float_t fVar6;
  value_type vVar7;
  value_type fr;
  brdf local_50;
  void *local_48;
  undefined8 local_40;
  float_t local_38;
  
  fVar6 = 0.0;
  if (wo_out->z <= 0.0) {
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this,u);
    pfVar3 = extraout_RDX;
  }
  else {
    local_40 = (**(code **)((long)*u + 0x30))(u,wi,wo_out,0);
    local_38 = fVar6;
    (**(code **)*u)(&local_50,u,wo_out,&local_40,fr._M_size);
    fVar5 = (float)(**(code **)((long)*u + 0x28))(u,wo_out,&local_40,fr._M_size);
    if (pdf_out != (float_t *)0x0) {
      pdf_out[2] = local_38;
      *(undefined8 *)pdf_out = local_40;
    }
    if (user_args != (void *)0x0) {
      *(float *)user_args = fVar5;
    }
    if (fVar5 <= 0.0) {
      (**(code **)((long)*u + 0x10))(this,u);
    }
    else {
      this->_vptr_brdf = (_func_int **)local_50;
      pp_Var2 = (_func_int **)operator_new((long)local_50._vptr_brdf << 2);
      this[1]._vptr_brdf = pp_Var2;
      pp_Var1 = this->_vptr_brdf;
      if (pp_Var1 != (_func_int **)0x0) {
        pp_Var4 = (_func_int **)0x0;
        do {
          *(float *)((long)pp_Var2 + (long)pp_Var4 * 4) =
               *(float *)((long)local_48 + (long)pp_Var4 * 4) / fVar5;
          pp_Var4 = (_func_int **)((long)pp_Var4 + 1);
        } while (pp_Var1 != pp_Var4);
      }
    }
    operator_delete(local_48);
    pfVar3 = extraout_RDX_00;
  }
  vVar7._M_data = pfVar3;
  vVar7._M_size = (size_t)this;
  return vVar7;
}

Assistant:

brdf::value_type
brdf::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf_out,
	const void *user_args
) const {
	if (wi.z > 0) {
		vec3 wo = u2_to_s2(u, wi);
		brdf::value_type fr = eval(wi, wo, user_args);
		float_t pdf = this->pdf(wi, wo, user_args);

		if (wo_out) (*wo_out) = wo;
		if (pdf_out) (*pdf_out) = pdf;

		return pdf > 0 ? fr / pdf : zero_value();
	} else {
		if (pdf_out) (*pdf_out) = 0;

		return zero_value();
	}
}